

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_lib.c
# Opt level: O0

EVP_MAC_CTX * EVP_MAC_CTX_new(EVP_MAC *mac)

{
  code *pcVar1;
  int iVar2;
  EVP_MAC_CTX *func;
  void *pvVar3;
  EVP_MAC *in_RDI;
  char *unaff_retaddr;
  EVP_MAC_CTX *ctx;
  undefined8 in_stack_fffffffffffffff0;
  
  func = (EVP_MAC_CTX *)
         CRYPTO_zalloc((size_t)unaff_retaddr,(char *)in_RDI,
                       (int)((ulong)in_stack_fffffffffffffff0 >> 0x20));
  if (func != (EVP_MAC_CTX *)0x0) {
    pcVar1 = (code *)in_RDI->newctx;
    pvVar3 = ossl_provider_ctx(in_RDI->prov);
    pvVar3 = (void *)(*pcVar1)(pvVar3);
    func->algctx = pvVar3;
    if ((pvVar3 != (void *)0x0) && (iVar2 = EVP_MAC_up_ref((EVP_MAC *)0x433ec8), iVar2 != 0)) {
      func->meth = in_RDI;
      return func;
    }
  }
  ERR_new();
  ERR_set_debug(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(char *)func);
  ERR_set_error(6,0xc0100,(char *)0x0);
  if (func != (EVP_MAC_CTX *)0x0) {
    (*(code *)in_RDI->freectx)(func->algctx);
  }
  CRYPTO_free(func);
  return (EVP_MAC_CTX *)0x0;
}

Assistant:

EVP_MAC_CTX *EVP_MAC_CTX_new(EVP_MAC *mac)
{
    EVP_MAC_CTX *ctx = OPENSSL_zalloc(sizeof(EVP_MAC_CTX));

    if (ctx == NULL
        || (ctx->algctx = mac->newctx(ossl_provider_ctx(mac->prov))) == NULL
        || !EVP_MAC_up_ref(mac)) {
        ERR_raise(ERR_LIB_EVP, ERR_R_MALLOC_FAILURE);
        if (ctx != NULL)
            mac->freectx(ctx->algctx);
        OPENSSL_free(ctx);
        ctx = NULL;
    } else {
        ctx->meth = mac;
    }
    return ctx;
}